

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O3

void __thiscall dg::DGLLVMPointsToSet::DGLLVMPointsToSet(DGLLVMPointsToSet *this,PointsToSetT *S)

{
  (this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).
  super_LLVMPointsToSetImpl._vptr_LLVMPointsToSetImpl =
       (_func_int **)&PTR___cxa_pure_virtual_00118970;
  (this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).PTSet = S;
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::begin(&(this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).it.
           container_it,&S->pointers);
  (this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>)._position = 0;
  (this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).
  super_LLVMPointsToSetImpl._vptr_LLVMPointsToSetImpl = (_func_int **)&PTR_hasUnknown_001188f8;
  if ((((this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).PTSet)->
      pointers)._bits.
      super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
      .
      super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ._M_h._M_element_count != 0) {
    _findNextReal(this);
    return;
  }
  return;
}

Assistant:

DGLLVMPointsToSet(const PointsToSetT &S) : LLVMPointsToSetImplTemplate(S) {
        initialize_iterator();
    }